

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::operator+
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,
          ChebyshevExpansion *ce2)

{
  LhsNested pMVar1;
  LhsNested pMVar2;
  VectorXd c;
  size_t n;
  void *local_80 [2];
  vectype local_70;
  Type local_60;
  LhsNested local_28;
  
  pMVar1 = (LhsNested)
           (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  pMVar2 = (LhsNested)
           (ce2->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if (pMVar1 == pMVar2) {
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&local_60,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)ce2,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_80,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_60);
    ChebyshevExpansion(__return_storage_ptr__,(vectype *)local_80,this->m_xmin,this->m_xmax);
  }
  else {
    if ((long)pMVar2 < (long)pMVar1) {
      local_60.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
      super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_data =
           (PointerType)pMVar1;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
                ((Matrix<double,__1,_1,_0,__1,_1> *)local_80,(long *)&local_60);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_80);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<long>
                (&local_60,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_80,
                 (ce2->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_rows);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&local_60.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
                 &ce2->m_c);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
                ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&local_60,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_80,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_70,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_60);
      ChebyshevExpansion(__return_storage_ptr__,&local_70,this->m_xmin,this->m_xmax);
    }
    else {
      local_28 = pMVar2;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
                ((Matrix<double,__1,_1,_0,__1,_1> *)local_80,(unsigned_long *)&local_28);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_80);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<long>
                (&local_60,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_80,
                 (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&local_60.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
                 &this->m_c);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
                ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&local_60,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_80,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)ce2);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_70,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_60);
      ChebyshevExpansion(__return_storage_ptr__,&local_70,this->m_xmin,this->m_xmax);
    }
    free(local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  free(local_80[0]);
  return __return_storage_ptr__;
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::operator+(const ChebyshevExpansion &ce2) const {
        if (m_c.size() == ce2.coef().size()) {
            // Both are the same size, nothing creative to do, just add the coefficients
            return ChebyshevExpansion(std::move(ce2.coef() + m_c), m_xmin, m_xmax);
        }
        else{
            if (m_c.size() > ce2.coef().size()) {
                Eigen::VectorXd c(m_c.size()); c.setZero(); c.head(ce2.coef().size()) = ce2.coef();
                return ChebyshevExpansion(c+m_c, m_xmin, m_xmax);
            }
            else {
                std::size_t n = ce2.coef().size();
                Eigen::VectorXd c(n); c.setZero(); c.head(m_c.size()) = m_c;
                return ChebyshevExpansion(c + ce2.coef(), m_xmin, m_xmax);
            }
        }
    }